

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerSafe::Init
          (Error *__return_storage_ptr__,CommissionerSafe *this,Config *aConfig)

{
  CommissionerHandler *__args_1;
  bool bVar1;
  int iVar2;
  event_base *peVar3;
  element_type *peVar4;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  ErrorCode local_2ac;
  Error local_2a8;
  event_base *local_280;
  shared_ptr<ot::commissioner::CommissionerImpl> local_278;
  anon_class_1_0_00000001 local_262;
  v10 local_261;
  v10 *local_260;
  size_t local_258;
  string local_250;
  Error local_230;
  anon_class_1_0_00000001 local_202;
  v10 local_201;
  v10 *local_200;
  size_t local_1f8;
  string local_1f0;
  Error local_1d0;
  undefined1 local_198 [8];
  timeval kDefaultNonIoEventTimeout;
  shared_ptr<ot::commissioner::CommissionerImpl> impl;
  Config *aConfig_local;
  CommissionerSafe *this_local;
  Error *error;
  undefined1 local_140 [16];
  v10 *local_130;
  ulong local_128;
  v10 *local_120;
  size_t sStack_118;
  string *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_108 [2];
  undefined1 local_f8 [16];
  v10 *local_e8;
  ulong local_e0;
  v10 *local_d8;
  size_t sStack_d0;
  string *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  v10 **local_80;
  v10 *local_78;
  size_t sStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined1 *local_60;
  Error **local_58;
  undefined1 *local_50;
  Error **local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_40;
  Error **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  Error::Error(__return_storage_ptr__);
  std::shared_ptr<ot::commissioner::CommissionerImpl>::shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerImpl> *)&kDefaultNonIoEventTimeout.tv_usec);
  local_198 = (undefined1  [8])0x15180;
  kDefaultNonIoEventTimeout.tv_sec = 0;
  peVar3 = EventBaseHolder::Get(&this->mEventBase);
  if (peVar3 == (event_base *)0x0) {
    Init::anon_class_1_0_00000001::operator()(&local_202);
    local_b8 = &local_200;
    local_c0 = &local_201;
    bVar5 = ::fmt::v10::operator()(local_c0);
    local_1f8 = bVar5.size_;
    local_200 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_c8 = &local_1f0;
    local_d8 = local_200;
    sStack_d0 = local_1f8;
    local_a0 = &local_d8;
    local_e8 = local_200;
    local_e0 = local_1f8;
    local_98 = local_e8;
    sStack_90 = local_e0;
    local_108[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_60 = local_f8;
    local_68 = local_108;
    local_18 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_68;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_e0;
    local_40 = local_68;
    local_20 = local_68;
    local_10 = local_60;
    ::fmt::v10::vformat_abi_cxx11_(&local_1f0,local_e8,fmt,args);
    Error::Error(&local_1d0,kOutOfMemory,&local_1f0);
    Error::operator=(__return_storage_ptr__,&local_1d0);
    Error::~Error(&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  else {
    Init::anon_class_1_0_00000001::operator()(&local_262);
    local_a8 = &local_260;
    local_b0 = &local_261;
    bVar5 = ::fmt::v10::operator()(local_b0);
    local_258 = bVar5.size_;
    local_260 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_110 = &local_250;
    local_120 = local_260;
    sStack_118 = local_258;
    local_80 = &local_120;
    local_130 = local_260;
    local_128 = local_258;
    local_78 = local_130;
    sStack_70 = local_128;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_50 = local_140;
    local_58 = &error;
    local_30 = 0;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_58;
    fmt_00.size_ = 0;
    fmt_00.data_ = (char *)local_128;
    local_48 = local_58;
    local_38 = local_58;
    local_28 = local_50;
    ::fmt::v10::vformat_abi_cxx11_(&local_250,local_130,fmt_00,args_00);
    Error::Error(&local_230,kUnknown,&local_250);
    Error::operator=(__return_storage_ptr__,&local_230);
    Error::~Error(&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    iVar2 = evthread_use_pthreads();
    if (iVar2 == 0) {
      peVar3 = EventBaseHolder::Get(&this->mEventBase);
      iVar2 = evthread_make_base_notifiable(peVar3);
      if (iVar2 == 0) {
        peVar3 = EventBaseHolder::Get(&this->mEventBase);
        iVar2 = event_assign(&this->mInvokeEvent,peVar3,-1,0x10,Invoke,this);
        if ((iVar2 == 0) &&
           (iVar2 = event_add(&this->mInvokeEvent,(timeval *)local_198), iVar2 == 0)) {
          __args_1 = this->mHandler;
          local_280 = EventBaseHolder::Get(&this->mEventBase);
          std::
          make_shared<ot::commissioner::CommissionerImpl,ot::commissioner::CommissionerHandler&,event_base*>
                    ((CommissionerHandler *)&local_278,(event_base **)__args_1);
          std::shared_ptr<ot::commissioner::CommissionerImpl>::operator=
                    ((shared_ptr<ot::commissioner::CommissionerImpl> *)
                     &kDefaultNonIoEventTimeout.tv_usec,&local_278);
          std::shared_ptr<ot::commissioner::CommissionerImpl>::~shared_ptr(&local_278);
          peVar4 = std::
                   __shared_ptr_access<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&kDefaultNonIoEventTimeout.tv_usec);
          (*(peVar4->super_Commissioner)._vptr_Commissioner[2])(&local_2a8,peVar4,aConfig);
          aError = Error::operator=(__return_storage_ptr__,&local_2a8);
          local_2ac = kNone;
          bVar1 = commissioner::operator!=(aError,&local_2ac);
          Error::~Error(&local_2a8);
          if (!bVar1) {
            std::shared_ptr<ot::commissioner::CommissionerImpl>::operator=
                      (&this->mImpl,
                       (shared_ptr<ot::commissioner::CommissionerImpl> *)
                       &kDefaultNonIoEventTimeout.tv_usec);
            StartEventLoopThread(this);
          }
        }
      }
    }
  }
  std::shared_ptr<ot::commissioner::CommissionerImpl>::~shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerImpl> *)&kDefaultNonIoEventTimeout.tv_usec);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::Init(const Config &aConfig)
{
    Error                             error;
    std::shared_ptr<CommissionerImpl> impl;

    // The default timeout value (1 day) for non-IO events (events with fd < 0).
    constexpr struct timeval kDefaultNonIoEventTimeout = {3600 * 24, 0};

    VerifyOrExit(mEventBase.Get() != nullptr, error = ERROR_OUT_OF_MEMORY("failed to create event base"));

    error = ERROR_UNKNOWN("failed to initialize event base");
    VerifyOrExit(evthread_use_pthreads() == 0);
    VerifyOrExit(evthread_make_base_notifiable(mEventBase.Get()) == 0);
    VerifyOrExit(event_assign(&mInvokeEvent, mEventBase.Get(), -1, EV_PERSIST, Invoke, this) == 0);

    // We add the event with a timeout value so that the event loop will not
    // exit prematurely because of no events.
    VerifyOrExit(event_add(&mInvokeEvent, &kDefaultNonIoEventTimeout) == 0);

    impl = std::make_shared<CommissionerImpl>(mHandler, mEventBase.Get());
    SuccessOrExit(error = impl->Init(aConfig));
    mImpl = impl;

    StartEventLoopThread();

exit:
    return error;
}